

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall
obs::safe_list<obs::slot<int_(int)>_>::erase
          (safe_list<obs::slot<int_(int)>_> *this,slot<int_(int)> *value)

{
  anon_class_8_1_898f5b00 local_30;
  node *node;
  unique_lock<std::mutex> lock;
  slot<int_(int)> *value_local;
  safe_list<obs::slot<int_(int)>_> *this_local;
  
  lock._8_8_ = value;
  ref(this);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&node,&this->m_mutex_nodes);
  local_30.node = this->m_first;
  do {
    if (local_30.node == (node *)0x0) {
LAB_0010bd0d:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&node);
      unref(this);
      return;
    }
    if ((local_30.node)->value == (slot<int_(int)> *)lock._8_8_) {
      if ((local_30.node)->value == (slot<int_(int)> *)0x0) {
        __assert_fail("node->value",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                      ,0x138,
                      "void obs::safe_list<obs::slot<int (int)>>::erase(T *) [T = obs::slot<int (int)>]"
                     );
      }
      safe_list<obs::slot<int_(int)>_>::node::unlock_all(local_30.node);
      (local_30.node)->value = (slot<int_(int)> *)0x0;
      this->m_delete_nodes = true;
      if ((local_30.node)->locks != 0) {
        std::condition_variable::
        wait<obs::safe_list<obs::slot<int(int)>>::erase(obs::slot<int(int)>*)::_lambda()_1_>
                  (&this->m_delete_cv,(unique_lock<std::mutex> *)&node,local_30);
      }
      if ((local_30.node)->locks != 0) {
        __assert_fail("node->locks == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                      ,0x146,
                      "void obs::safe_list<obs::slot<int (int)>>::erase(T *) [T = obs::slot<int (int)>]"
                     );
      }
      goto LAB_0010bd0d;
    }
    local_30.node = (local_30.node)->next;
  } while( true );
}

Assistant:

void erase(T* value) {
    // We add a ref to avoid calling delete_nodes().
    ref();
    {
      std::unique_lock<std::mutex> lock(m_mutex_nodes);

      for (node* node=m_first; node; node=node->next) {
        if (node->value == value) {
          // We disable the node so it isn't used anymore by other
          // iterators.
          assert(node->value);
          node->unlock_all();
          node->value = nullptr;
          m_delete_nodes = true;

          // In this case we should wait until the node is unlocked,
          // because after erase() the client could be deleting the
          // value that we are using in other thread.
          if (node->locks) {
            // Wait until the node is completely unlocked by other
            // threads.
            m_delete_cv.wait(lock, [node]{ return node->locks == 0; });
          }

          assert(node->locks == 0);

          // The node will be finally deleted when we leave the
          // iteration loop (m_ref==0, i.e. the end() iterator is
          // destroyed)
          break;
        }
      }
    }
    unref();
  }